

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findCliqueHeu.cpp
# Opt level: O0

int maxCliqueHeu(CGraphIO *gio)

{
  pointer *this;
  int iVar1;
  int iVar2;
  value_type vVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  size_type sVar5;
  reference pvVar6;
  int local_b8;
  int local_b4;
  int j_2;
  int k;
  int j_1;
  int imd1;
  int imdv1;
  int j;
  int iLoopCount;
  int imd;
  int imdv;
  int z;
  int iCandidateVertex;
  int notComputed;
  int iCount1;
  int iCount;
  int iPos1;
  int iPos;
  value_type local_64;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> v_i_S1;
  vector<int,_std::allocator<int>_> v_i_S;
  int icc;
  int u;
  int maxClq;
  vector<int,_std::allocator<int>_> *p_v_i_Edges;
  vector<int,_std::allocator<int>_> *p_v_i_Vertices;
  CGraphIO *gio_local;
  
  this_00 = CGraphIO::GetVerticesPtr(gio);
  this_01 = CGraphIO::GetEdgesPtr(gio);
  maxDegree = CGraphIO::GetMaximumVertexDegree(gio);
  icc = -1;
  this = &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
  local_64 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this,(long)(maxDegree + 1),&local_64);
  iPos1 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_60,(long)(maxDegree + 1),&iPos1);
  imdv = 0;
  do {
    sVar5 = std::vector<int,_std::allocator<int>_>::size(this_00);
    if (sVar5 - 1 <= (ulong)(long)imdv) {
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60)
      ;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return icc;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(imdv + 1));
    iVar1 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)imdv);
    if (icc <= iVar1 - *pvVar6) {
      iCount = 1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      *pvVar6 = imdv;
      std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(imdv + 1));
      std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)imdv);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(imdv + 1));
      iVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)imdv);
      for (imd1 = *pvVar6; imd1 < iVar1; imd1 = imd1 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)imd1);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(*pvVar6 + 1));
        iVar2 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)imd1);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar6);
        if (icc <= iVar2 - *pvVar6) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)imd1);
          vVar3 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)iCount);
          *pvVar6 = vVar3;
          iCount = iCount + 1;
        }
      }
      v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      while (0 < iCount) {
        v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(iCount + -1));
        iVar1 = *pvVar6;
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(iVar1 + 1));
        std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
        iCount1 = 0;
        for (j_2 = 0; j_2 < iCount; j_2 = j_2 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(iVar1 + 1));
          iVar2 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)iVar1);
          for (local_b4 = *pvVar6; local_b4 < iVar2; local_b4 = local_b4 + 1) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(long)j_2);
            iVar4 = *pvVar6;
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_b4);
            if (iVar4 == *pvVar6) {
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_b4);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (this_00,(long)(*pvVar6 + 1));
              iVar4 = *pvVar6;
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_b4);
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar6);
              if (icc <= iVar4 - *pvVar6) {
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage,(long)j_2);
                vVar3 = *pvVar6;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_60,(long)iCount1);
                *pvVar6 = vVar3;
                iCount1 = iCount1 + 1;
                break;
              }
            }
          }
        }
        for (local_b8 = 0; local_b8 < iCount1; local_b8 = local_b8 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_60,(long)local_b8);
          vVar3 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &v_i_S1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)local_b8);
          *pvVar6 = vVar3;
        }
        iCount = iCount1;
      }
      if (icc < v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._4_4_) {
        icc = v_i_S.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
      }
    }
    imdv = imdv + 1;
  } while( true );
}

Assistant:

int maxCliqueHeu(CGraphIO& gio)
{
	vector <int>* p_v_i_Vertices = gio.GetVerticesPtr();
	vector <int>* p_v_i_Edges = gio.GetEdgesPtr();

	//srand(time(NULL));

	maxDegree = gio.GetMaximumVertexDegree();
	int maxClq = - 1, u, icc;
	vector < int > v_i_S;
	vector < int > v_i_S1;
	v_i_S.resize(maxDegree + 1, 0);
	v_i_S1.resize(maxDegree + 1, 0);

	int iPos, iPos1, iCount, iCount1;

	int notComputed = 0;

	// compute the max clique for each vertex
	for(int iCandidateVertex = 0; iCandidateVertex < p_v_i_Vertices->size() - 1; iCandidateVertex++)
	{
		// Pruning 1
		if(maxClq > ((*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex]))
		{
			notComputed++;
			continue;
		}
		
		iPos = 0;		
		v_i_S[iPos++] = iCandidateVertex;
		int z, imdv = iCandidateVertex, imd = (*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex];

		int iLoopCount = (*p_v_i_Vertices)[iCandidateVertex + 1];
		for(int j = (*p_v_i_Vertices)[iCandidateVertex]; j < iLoopCount; j++)
		{
			// Pruning 3
			if(maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[j] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[j]]))
				v_i_S[iPos++] = (*p_v_i_Edges)[j];
		}

		icc = 0;
		
		while(iPos > 0)
		{
			int imdv1 = -1, imd1 = -1;

			icc++;

			// generate a random number x from 0 to iPos -1
			// aasign that imdv = x and imd = d(x)
			//imdv = v_i_S[rand() % iPos];
			imdv = v_i_S[iPos-1];
			imd = (*p_v_i_Vertices)[imdv + 1] - (*p_v_i_Vertices)[imdv];

			iPos1 = 0;

			for(int j = 0; j < iPos; j++)
			{
				iLoopCount = (*p_v_i_Vertices)[imdv + 1];
				for(int k = (*p_v_i_Vertices)[imdv]; k < iLoopCount; k++)
				{
					// Pruning 5
					if(v_i_S[j] == (*p_v_i_Edges)[k] && maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[k] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[k]]))
					{
						v_i_S1[iPos1++] = v_i_S[j]; // calculate the max degree vertex here
						
						break;
					}
				}
			}

			for(int j = 0; j < iPos1; j++)
				v_i_S[j] = v_i_S1[j];
			
			iPos = iPos1;

			imdv = imdv1;
			imd = imd1;			
		}
	
		if(maxClq < icc)
			maxClq = icc;
			
	}

	return maxClq;
}